

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

bool AvalancheTest<Blob<512>,Blob<256>>(pfHash hash,int reps,bool verbose)

{
  byte in_DL;
  uint in_ESI;
  double dVar1;
  double b;
  bool result;
  Rand *in_stack_00000028;
  int in_stack_00000034;
  vector<int,_std::allocator<int>_> *in_stack_00000038;
  vector<int,_std::allocator<int>_> bins;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  Rand r;
  uint32_t in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar2;
  allocator_type *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *this;
  size_type in_stack_ffffffffffffff98;
  int reps_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa4;
  vector<int,_std::allocator<int>_> local_4d;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  byte local_d;
  uint local_c;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  Rand::Rand((Rand *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c);
  local_24 = 0x40;
  local_28 = 0x20;
  local_2c = 0x200;
  local_30 = 0x100;
  printf("Testing %4d-bit keys -> %3d-bit hashes, %6d reps",0x200,0x100,(ulong)local_c);
  local_4d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _1_4_ = 0;
  this = &local_4d;
  std::allocator<int>::allocator((allocator<int> *)0x19560d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
             ,(value_type_conflict *)this,in_stack_ffffffffffffff88);
  reps_00 = (int)(in_stack_ffffffffffffff98 >> 0x20);
  std::allocator<int>::~allocator((allocator<int> *)0x195632);
  calcBias<Blob<512>,Blob<256>>
            ((pfHash)bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,in_stack_00000038,in_stack_00000034,
             in_stack_00000028,b._7_1_);
  uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
  dVar1 = maxBias((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_ffffffffffffffa4,uVar3),
                  reps_00);
  bVar2 = (byte)((uint)uVar3 >> 0x18);
  printf(" worst bias is %f%%",dVar1 * 100.0);
  if (0.01 < dVar1) {
    printf(" !!!!!");
    bVar2 = 0;
  }
  printf("\n");
  std::vector<int,_std::allocator<int>_>::~vector(this);
  return (bool)(bVar2 & 1);
}

Assistant:

bool AvalancheTest ( pfHash hash, const int reps, bool verbose )
{
  Rand r(48273);
  
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  printf("Testing %4d-bit keys -> %3d-bit hashes, %6d reps",
         keybits, hashbits, reps);

  //----------

  std::vector<int> bins(keybits*hashbits,0);

  calcBias<keytype,hashtype>(hash,bins,reps,r,verbose);
  
  //----------

  bool result = true;

  double b = maxBias(bins,reps);

  printf(" worst bias is %f%%", b * 100.0);

  if(b > AVALANCHE_FAIL)
  {
    printf(" !!!!!");
    result = false;
  }
  printf("\n");
  return result;
}